

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O0

void get_palette_params(MACROBLOCK *x,int plane,BLOCK_SIZE bsize,Av1ColorMapParam *params)

{
  long lVar1;
  int *in_RCX;
  BLOCK_SIZE in_DL;
  int in_ESI;
  long in_RDI;
  PALETTE_MODE_INFO *pmi;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  long local_40;
  long local_38;
  
  lVar1 = **(long **)(in_RDI + 0x2058);
  *(uint8_t **)(in_RCX + 6) = ((MACROBLOCKD *)(in_RDI + 0x1a0))->plane[in_ESI].color_index_map;
  if (in_ESI == 0) {
    local_38 = *(long *)(in_RDI + 0x2b38) + 0x26d8;
  }
  else {
    local_38 = *(long *)(in_RDI + 0x2b38) + 0x294e;
  }
  *(long *)(in_RCX + 8) = local_38;
  if (in_ESI == 0) {
    local_40 = in_RDI + 0x7558;
  }
  else {
    local_40 = in_RDI + 0x79b8;
  }
  *(long *)(in_RCX + 10) = local_40;
  in_RCX[2] = (uint)*(byte *)(lVar1 + 0x8e + (long)in_ESI);
  av1_get_block_dimensions
            (in_DL,in_ESI,(MACROBLOCKD *)(in_RDI + 0x1a0),in_RCX + 3,(int *)0x0,in_RCX,in_RCX + 1);
  return;
}

Assistant:

static void get_palette_params(const MACROBLOCK *const x, int plane,
                               BLOCK_SIZE bsize, Av1ColorMapParam *params) {
  const MACROBLOCKD *const xd = &x->e_mbd;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  params->color_map = xd->plane[plane].color_index_map;
  params->map_cdf = plane ? xd->tile_ctx->palette_uv_color_index_cdf
                          : xd->tile_ctx->palette_y_color_index_cdf;
  params->color_cost = plane ? x->mode_costs.palette_uv_color_cost
                             : x->mode_costs.palette_y_color_cost;
  params->n_colors = pmi->palette_size[plane];
  av1_get_block_dimensions(bsize, plane, xd, &params->plane_width, NULL,
                           &params->rows, &params->cols);
}